

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

matroska_block *
MATROSKA_GetBlockForTimestamp(matroska_cluster *Cluster,mkv_timestamp_t Timestamp,int16_t Track)

{
  matroska_block *pmVar1;
  uint16_t uVar2;
  ebml_context *peVar3;
  bool_t bVar4;
  mkv_timestamp_t mVar5;
  undefined6 in_register_00000012;
  uint uVar6;
  matroska_block *pmVar7;
  matroska_block *Block;
  bool bVar8;
  
  Block = (matroska_block *)(Cluster->Base).Base.Base.Children;
  do {
    if (Block == (matroska_block *)0x0) {
      return (matroska_block *)0x0;
    }
    peVar3 = MATROSKA_getContextBlockGroup();
    bVar4 = EBML_ElementIsType((ebml_element *)Block,peVar3);
    uVar6 = (uint)CONCAT62(in_register_00000012,Track);
    if (bVar4 == 0) {
      peVar3 = MATROSKA_getContextSimpleBlock();
      bVar4 = EBML_ElementIsType((ebml_element *)Block,peVar3);
      if (((bVar4 != 0) && (uVar2 = MATROSKA_BlockTrackNum(Block), uVar2 == uVar6)) &&
         (mVar5 = MATROSKA_BlockTimestamp(Block), mVar5 == Timestamp)) {
        return Block;
      }
    }
    else {
      pmVar7 = (matroska_block *)(Block->Base).Base.Base.Children;
      while (pmVar7 != (matroska_block *)0x0) {
        peVar3 = MATROSKA_getContextBlock();
        bVar4 = EBML_ElementIsType((ebml_element *)pmVar7,peVar3);
        if (((bVar4 != 0) && (uVar2 = MATROSKA_BlockTrackNum(pmVar7), uVar2 == uVar6)) &&
           (mVar5 = MATROSKA_BlockTimestamp(pmVar7), mVar5 == Timestamp)) {
          return pmVar7;
        }
        pmVar1 = (matroska_block *)(pmVar7->Base).Base.Base.Next;
        bVar8 = pmVar7 == pmVar1;
        pmVar7 = pmVar1;
        if (bVar8) {
          __assert_fail("(nodetree*)(GBlock) != ((nodetree*)(GBlock))->Next",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x360,
                        "matroska_block *MATROSKA_GetBlockForTimestamp(matroska_cluster *, mkv_timestamp_t, int16_t)"
                       );
        }
      }
    }
    pmVar7 = (matroska_block *)(Block->Base).Base.Base.Next;
    bVar8 = Block == pmVar7;
    Block = pmVar7;
    if (bVar8) {
      __assert_fail("(nodetree*)(Block) != ((nodetree*)(Block))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x35c,
                    "matroska_block *MATROSKA_GetBlockForTimestamp(matroska_cluster *, mkv_timestamp_t, int16_t)"
                   );
    }
  } while( true );
}

Assistant:

matroska_block *MATROSKA_GetBlockForTimestamp(matroska_cluster *Cluster, mkv_timestamp_t Timestamp, int16_t Track)
{
    ebml_element *Block, *GBlock;
    for (Block = EBML_MasterChildren(Cluster);Block;Block=EBML_MasterNext(Block))
    {
        if (EBML_ElementIsType(Block, MATROSKA_getContextBlockGroup()))
        {
            for (GBlock = EBML_MasterChildren(Block);GBlock;GBlock=EBML_MasterNext(GBlock))
            {
                if (EBML_ElementIsType(GBlock, MATROSKA_getContextBlock()))
                {
                    if (MATROSKA_BlockTrackNum((matroska_block*)GBlock) == Track &&
                        MATROSKA_BlockTimestamp((matroska_block*)GBlock) == Timestamp)
                    {
                        return (matroska_block*)GBlock;
                    }
                }
            }
        }
        else if (EBML_ElementIsType(Block, MATROSKA_getContextSimpleBlock()))
        {
            if (MATROSKA_BlockTrackNum((matroska_block*)Block) == Track &&
                MATROSKA_BlockTimestamp((matroska_block*)Block) == Timestamp)
            {
                return (matroska_block*)Block;
            }
        }
    }
    return NULL;
}